

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O1

void __thiscall miniros::Timer::Timer(Timer *this,TimerOptions *ops)

{
  element_type *peVar1;
  element_type *peVar2;
  Impl *this_00;
  
  this_00 = (Impl *)operator_new(0x50);
  Impl::Impl(this_00);
  (this->impl_).super___shared_ptr<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<miniros::Timer::Impl*>
            (&(this->impl_).super___shared_ptr<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,this_00);
  (((this->impl_).super___shared_ptr<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  period_).super_DurationBase<miniros::Duration> =
       (ops->period).super_DurationBase<miniros::Duration>;
  std::function<void_(const_miniros::TimerEvent_&)>::operator=
            (&((this->impl_).super___shared_ptr<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->callback_,&ops->callback);
  peVar1 = (this->impl_).super___shared_ptr<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  peVar2 = (ops->tracked_object).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->callback_queue_ = ops->callback_queue;
  (peVar1->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2
  ;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(ops->tracked_object).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  peVar1 = (this->impl_).super___shared_ptr<miniros::Timer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  peVar1->has_tracked_object_ =
       (ops->tracked_object).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0;
  peVar1->oneshot_ = ops->oneshot;
  return;
}

Assistant:

Timer::Timer(const TimerOptions& ops)
: impl_(new Impl)
{
  impl_->period_ = ops.period;
  impl_->callback_ = ops.callback;
  impl_->callback_queue_ = ops.callback_queue;
  impl_->tracked_object_ = ops.tracked_object;
  impl_->has_tracked_object_ = (ops.tracked_object != NULL);
  impl_->oneshot_ = ops.oneshot;
}